

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenIfSetIfTrue(BinaryenExpressionRef expr,BinaryenExpressionRef ifTrueExpr)

{
  if (expr->_id != IfId) {
    __assert_fail("expression->is<If>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x828,"void BinaryenIfSetIfTrue(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (ifTrueExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)ifTrueExpr;
    return;
  }
  __assert_fail("ifTrueExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x829,"void BinaryenIfSetIfTrue(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenIfSetIfTrue(BinaryenExpressionRef expr,
                         BinaryenExpressionRef ifTrueExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<If>());
  assert(ifTrueExpr);
  static_cast<If*>(expression)->ifTrue = (Expression*)ifTrueExpr;
}